

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cpp
# Opt level: O2

void __thiscall argo::unparser::print_indent(unparser *this,int indent_level)

{
  writer *w;
  int iVar1;
  bool bVar2;
  allocator local_49;
  string local_48;
  
  iVar1 = 0;
  if (0 < indent_level) {
    iVar1 = indent_level;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    w = this->m_writer;
    std::__cxx11::string::string((string *)&local_48,this->m_indent,&local_49);
    operator<<(w,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void unparser::print_indent(int indent_level)
{
    for (int i = 0; i < indent_level; i++)
    {
        m_writer << m_indent;
    }
}